

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall cnn::Parameters::accumulate_grad(Parameters *this,Tensor *d)

{
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  Index size;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ushort uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  int iVar25;
  ulong uVar10;
  
  uVar10 = (ulong)(d->d).nd;
  iVar25 = 1;
  iVar24 = 1;
  if (uVar10 != 0) {
    auVar17 = vpbroadcastq_avx512f();
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar12 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar18,auVar19);
      auVar18 = vporq_avx512f(auVar18,auVar20);
      uVar6 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar22,auVar17,2);
      bVar8 = (byte)uVar6;
      uVar15 = CONCAT11(bVar8,bVar7);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((d->d).d + uVar12));
      auVar22._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar18._4_4_;
      auVar22._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar18._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar18._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar18._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar18._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar18._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar18._28_4_;
      auVar22._32_4_ = (uint)(bVar8 & 1) * auVar18._32_4_;
      auVar22._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar18._36_4_;
      auVar22._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar18._40_4_;
      auVar22._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar18._44_4_;
      auVar22._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar18._48_4_;
      auVar22._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar18._52_4_;
      auVar22._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar18._56_4_;
      auVar22._60_4_ = (uint)(bVar8 >> 7) * auVar18._60_4_;
      auVar18 = vpmulld_avx512f(auVar22,auVar21);
      uVar12 = uVar12 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
    auVar17 = vmovdqa32_avx512f(auVar18);
    auVar18._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar21._0_4_;
    bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * auVar21._4_4_;
    bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * auVar21._8_4_;
    bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * auVar21._12_4_;
    bVar3 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar3 * auVar17._16_4_ | (uint)!bVar3 * auVar21._16_4_;
    bVar3 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar3 * auVar17._20_4_ | (uint)!bVar3 * auVar21._20_4_;
    bVar3 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar3 * auVar17._24_4_ | (uint)!bVar3 * auVar21._24_4_;
    bVar3 = (bool)((byte)(uVar15 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar3 * auVar17._28_4_ | (uint)!bVar3 * auVar21._28_4_;
    auVar18._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar21._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar3 * auVar17._36_4_ | (uint)!bVar3 * auVar21._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar3 * auVar17._40_4_ | (uint)!bVar3 * auVar21._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar3 * auVar17._44_4_ | (uint)!bVar3 * auVar21._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar3 * auVar17._48_4_ | (uint)!bVar3 * auVar21._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar3 * auVar17._52_4_ | (uint)!bVar3 * auVar21._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar3 * auVar17._56_4_ | (uint)!bVar3 * auVar21._56_4_;
    auVar18._60_4_ =
         (uint)(bVar8 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar21._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar17 = vpmulld_avx512f(auVar18,ZEXT3264(auVar16));
    auVar4 = vpmulld_avx(auVar17._0_16_,auVar17._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar24 = auVar4._0_4_;
  }
  uVar10 = (ulong)(this->g).d.nd;
  if (uVar10 != 0) {
    auVar17 = vpbroadcastq_avx512f();
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar12 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar18,auVar19);
      auVar18 = vporq_avx512f(auVar18,auVar20);
      uVar6 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar22,auVar17,2);
      bVar8 = (byte)uVar6;
      uVar15 = CONCAT11(bVar8,bVar7);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->g).d.d + uVar12));
      auVar23._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar18._4_4_;
      auVar23._0_4_ = (uint)(bVar7 & 1) * auVar18._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar18._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar18._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar18._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar18._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar18._24_4_;
      auVar23._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar18._28_4_;
      auVar23._32_4_ = (uint)(bVar8 & 1) * auVar18._32_4_;
      auVar23._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar18._36_4_;
      auVar23._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar18._40_4_;
      auVar23._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar18._44_4_;
      auVar23._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar18._48_4_;
      auVar23._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar18._52_4_;
      auVar23._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar18._56_4_;
      auVar23._60_4_ = (uint)(bVar8 >> 7) * auVar18._60_4_;
      auVar18 = vpmulld_avx512f(auVar23,auVar21);
      uVar12 = uVar12 + 0x10;
    } while ((uVar10 + 0xf & 0x1fffffff0) != uVar12);
    auVar17 = vmovdqa32_avx512f(auVar18);
    auVar19._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar21._0_4_;
    bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * auVar21._4_4_;
    bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * auVar21._8_4_;
    bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * auVar21._12_4_;
    bVar3 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar3 * auVar17._16_4_ | (uint)!bVar3 * auVar21._16_4_;
    bVar3 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar3 * auVar17._20_4_ | (uint)!bVar3 * auVar21._20_4_;
    bVar3 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar3 * auVar17._24_4_ | (uint)!bVar3 * auVar21._24_4_;
    bVar3 = (bool)((byte)(uVar15 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar3 * auVar17._28_4_ | (uint)!bVar3 * auVar21._28_4_;
    auVar19._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar21._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar19._36_4_ = (uint)bVar3 * auVar17._36_4_ | (uint)!bVar3 * auVar21._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar19._40_4_ = (uint)bVar3 * auVar17._40_4_ | (uint)!bVar3 * auVar21._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar19._44_4_ = (uint)bVar3 * auVar17._44_4_ | (uint)!bVar3 * auVar21._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar19._48_4_ = (uint)bVar3 * auVar17._48_4_ | (uint)!bVar3 * auVar21._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar19._52_4_ = (uint)bVar3 * auVar17._52_4_ | (uint)!bVar3 * auVar21._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar19._56_4_ = (uint)bVar3 * auVar17._56_4_ | (uint)!bVar3 * auVar21._56_4_;
    auVar19._60_4_ =
         (uint)(bVar8 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar21._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar19,1);
    auVar17 = vpmulld_avx512f(auVar19,ZEXT3264(auVar16));
    auVar4 = vpmulld_avx(auVar17._0_16_,auVar17._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar25 = auVar4._0_4_;
  }
  uVar9 = iVar25 * (this->g).d.bd;
  uVar10 = (ulong)uVar9;
  if (uVar9 != iVar24 * (d->d).bd) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  pfVar1 = (this->g).v;
  uVar12 = uVar10;
  if ((((ulong)pfVar1 & 3) == 0) &&
     (uVar12 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 0xf), uVar10 <= uVar12)) {
    uVar12 = uVar10;
  }
  pfVar2 = d->v;
  uVar13 = uVar10 - uVar12;
  uVar11 = uVar13 + 0xf;
  if (-1 < (long)uVar13) {
    uVar11 = uVar13;
  }
  if (uVar12 != 0) {
    uVar14 = 0;
    do {
      pfVar1[uVar14] = pfVar1[uVar14] + pfVar2[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
  }
  uVar11 = (uVar11 & 0xfffffffffffffff0) + uVar12;
  if (0xf < (long)uVar13) {
    do {
      auVar17 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar1 + uVar12),
                               *(undefined1 (*) [64])(pfVar2 + uVar12));
      *(undefined1 (*) [64])(pfVar1 + uVar12) = auVar17;
      uVar12 = uVar12 + 0x10;
    } while ((long)uVar12 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar10) {
    do {
      pfVar1[uVar11] = pfVar1[uVar11] + pfVar2[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  return;
}

Assistant:

void Parameters::accumulate_grad(const Tensor& d) {
#if HAVE_CUDA
  CUBLAS_CHECK(cublasSaxpy(cublas_handle, g.d.size(), kSCALAR_ONE, d.v, 1, g.v, 1));
#else
  g.vec() += d.vec();
#endif
}